

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenUnionCreatorForStruct
          (PythonGenerator *this,EnumDef *enum_def,EnumVal *ev,string *code_ptr)

{
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string package_reference;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string field_type;
  undefined1 local_70 [8];
  string variant;
  string union_type;
  string *code;
  string *code_ptr_local;
  EnumVal *ev_local;
  EnumDef *enum_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Type_abi_cxx11_((string *)((long)&variant.field_2 + 8),&this->namer_,enum_def);
  IdlNamer::Variant_abi_cxx11_((string *)local_70,&this->namer_,ev);
  IdlNamer::ObjectType_abi_cxx11_((string *)local_a0,&this->namer_,(ev->union_type).struct_def);
  GenIndents_abi_cxx11_((string *)((long)&package_reference.field_2 + 8),this,1);
  std::operator+(&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&package_reference.field_2 + 8),"if unionType == ");
  std::operator+(&local_120,&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&variant.field_2 + 8));
  std::operator+(&local_100,&local_120,".");
  std::operator+(&local_e0,&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_c0,&local_e0,":");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)(package_reference.field_2._M_local_buf + 8));
  if (((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers & 1U) != 0) {
    GenPackageReference_abi_cxx11_((string *)local_180,this,&ev->union_type);
    GenIndents_abi_cxx11_(&local_1e0,this,2);
    std::operator+(&local_1c0,&local_1e0,"import ");
    std::operator+(&local_1a0,&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator+(&local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                   ".");
    std::operator+(&local_200,&local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::__cxx11::string::operator=((string *)local_a0,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)local_180);
  }
  GenIndents_abi_cxx11_(&local_2a0,this,2);
  std::operator+(&local_280,&local_2a0,"return ");
  std::operator+(&local_260,&local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::operator+(&local_240,&local_260,".InitFromBuf(table.Bytes, table.Pos)");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(variant.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenUnionCreatorForStruct(const EnumDef &enum_def, const EnumVal &ev,
                                std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto union_type = namer_.Type(enum_def);
    const auto variant = namer_.Variant(ev);
    auto field_type = namer_.ObjectType(*ev.union_type.struct_def);

    code +=
        GenIndents(1) + "if unionType == " + union_type + "." + variant + ":";
    if (parser_.opts.include_dependence_headers) {
      auto package_reference = GenPackageReference(ev.union_type);
      code += GenIndents(2) + "import " + package_reference;
      field_type = package_reference + "." + field_type;
    }
    code += GenIndents(2) + "return " + field_type +
            ".InitFromBuf(table.Bytes, table.Pos)";
  }